

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

double house_2(double *x,int N,double *v)

{
  double dVar1;
  double *C;
  double *__ptr;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  C = (double *)malloc(8);
  __ptr = (double *)malloc((long)N * 8);
  mmult(x,x,C,1,N,1);
  dVar5 = *C;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  *C = dVar5;
  for (lVar2 = 1; lVar2 < N; lVar2 = lVar2 + 1) {
    __ptr[lVar2] = 0.0;
  }
  dVar1 = *x;
  dVar6 = 1.0;
  if (dVar1 <= 0.0) {
    if (0.0 <= dVar1) {
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        dVar6 = 0.0;
      }
    }
    else {
      dVar6 = -1.0;
    }
  }
  *__ptr = dVar5 * dVar6;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    v[uVar3] = __ptr[uVar3] + x[uVar3];
  }
  mmult(v,v,C,1,N,1);
  dVar5 = *C;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    v[uVar3] = v[uVar3] / dVar5;
  }
  free(C);
  free(__ptr);
  return 2.0;
}

Assistant:

double house_2(double*x,int N,double *v) {
	double sgn,beta,sc;
	double *sigma,*e;
	int i;
	
	sigma = (double*) malloc(sizeof(double) * 1);
	e = (double*) malloc(sizeof(double) * N);
	
	beta = 2.0;
	sgn = 1.0;
	mmult(x,x,sigma,1,N,1);
	sigma[0] = sqrt(sigma[0]);
	
	e[0] =1.;
	for (i = 1; i < N;++i) {
		e[i] = 0.;
	}
	
	if (x[0] > 0.) {
		sgn = 1.0;
	} else if (x[0] < 0.) {
		sgn = -1.0;
	} else if (x[0] == 0.) {
		sgn = 0.;
	}
	
	sc = sigma[0] * sgn;
	
	//scale(e,N,1,sc);
	
	e[0] *= sc;
	
	for(i = 0; i < N;++i) {
		v[i] = e[i] + x[i];
	}
	
	mmult(v,v,sigma,1,N,1);
	sigma[0] = sqrt(sigma[0]);
	
	for(i = 0; i < N;++i) {
		v[i] = v[i] / sigma[0];
	}
	
	free(sigma);
	free(e);
	return beta;
}